

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

bool __thiscall presolve::HPresolve::isImpliedInteger(HPresolve *this,HighsInt col)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  HighsLp *pHVar5;
  bool bVar6;
  long lVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  double *pdVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  int *piVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  lVar12 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
  if (lVar12 != -1) {
    piVar4 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar12;
    piVar11 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + lVar12;
    bVar6 = true;
    do {
      iVar2 = *piVar11;
      iVar3 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2];
      if ((iVar3 < 2) ||
         ((this->rowsizeImplInt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2] +
          (this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2] < iVar3 + -1)) {
LAB_00305491:
        bVar6 = false;
      }
      else {
        pHVar5 = this->model;
        dVar13 = (this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
        dVar14 = -dVar13;
        pdVar1 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar2;
        pvVar8 = &pHVar5->row_lower_;
        if (*pdVar1 <= dVar14 && dVar14 != *pdVar1) {
          pvVar8 = &pHVar5->row_upper_;
        }
        pvVar10 = &pHVar5->row_upper_;
        if (dVar13 < (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar2]) {
          pvVar10 = &pHVar5->row_lower_;
        }
        dVar13 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar2];
        pdVar1 = (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + iVar2;
        if ((dVar13 == *pdVar1) && (!NAN(dVar13) && !NAN(*pdVar1))) {
          dVar13 = *pdVar9;
          dVar15 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2] * (1.0 / dVar13);
          dVar14 = round(dVar15);
          dVar14 = ABS(dVar15 - dVar14);
          if ((dVar14 < this->primal_feastol || dVar14 == this->primal_feastol) &&
             (bVar6 = rowCoefficientsIntegral(this,iVar2,1.0 / dVar13), bVar6)) {
            return true;
          }
          goto LAB_00305491;
        }
      }
      lVar7 = (long)(int)lVar12;
      lVar12 = (long)piVar4[lVar7];
      piVar11 = piVar11 + (lVar12 - lVar7);
      pdVar9 = pdVar9 + (lVar12 - lVar7);
    } while (lVar12 != -1);
    if (!bVar6) {
      return false;
    }
  }
  pHVar5 = this->model;
  dVar13 = (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[col];
  if (((dVar13 <= -INFINITY) ||
      (dVar14 = round(dVar13),
      pdVar9 = &(this->options->super_HighsOptionsStruct).small_matrix_value,
      ABS(dVar13 - dVar14) < *pdVar9 || ABS(dVar13 - dVar14) == *pdVar9)) &&
     ((dVar13 = (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[col], INFINITY <= dVar13 ||
      (dVar14 = round(dVar13),
      pdVar9 = &(this->options->super_HighsOptionsStruct).small_matrix_value,
      ABS(dVar13 - dVar14) < *pdVar9 || ABS(dVar13 - dVar14) == *pdVar9)))) {
    lVar12 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[col];
    if (lVar12 == -1) {
      return true;
    }
    pdVar9 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar12;
    piVar11 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + lVar12;
    piVar4 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    while( true ) {
      dVar14 = 1.0 / *pdVar9;
      pHVar5 = this->model;
      iVar2 = *piVar11;
      dVar13 = (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar2];
      if (((dVar13 < INFINITY) &&
          (dVar13 = dVar13 * dVar14, dVar15 = round(dVar13), dVar13 = ABS(dVar13 - dVar15),
          this->primal_feastol <= dVar13 && dVar13 != this->primal_feastol)) ||
         (((dVar13 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar2], -INFINITY < dVar13 &&
           (dVar13 = dVar13 * dVar14, dVar15 = round(dVar13), dVar13 = ABS(dVar13 - dVar15),
           this->primal_feastol <= dVar13 && dVar13 != this->primal_feastol)) ||
          (bVar6 = rowCoefficientsIntegral(this,iVar2,dVar14), !bVar6)))) break;
      lVar7 = (long)(int)lVar12;
      lVar12 = (long)piVar4[lVar7];
      piVar11 = piVar11 + (lVar12 - lVar7);
      pdVar9 = pdVar9 + (lVar12 - lVar7);
      if (lVar12 == -1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool HPresolve::isImpliedInteger(HighsInt col) {
  // check if a continuous variable is implied integer
  assert(model->integrality_[col] == HighsVarType::kContinuous);

  bool runDualDetection = true;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    // if not all other columns are integer, skip row and also do not try the
    // dual detection in the second loop as it must hold for all rows
    if (rowsize[nz.index()] < 2 ||
        rowsizeInteger[nz.index()] + rowsizeImplInt[nz.index()] <
            rowsize[nz.index()] - 1) {
      runDualDetection = false;
      continue;
    }

    double rowLower = isImpliedEquationAtUpper(nz.index())
                          ? model->row_upper_[nz.index()]
                          : model->row_lower_[nz.index()];

    double rowUpper = isImpliedEquationAtLower(nz.index())
                          ? model->row_lower_[nz.index()]
                          : model->row_upper_[nz.index()];

    if (rowUpper == rowLower) {
      // if there is an equation the dual detection does not need to be tried
      runDualDetection = false;
      double scale = 1.0 / nz.value();

      if (fractionality(model->row_lower_[nz.index()] * scale) >
          primal_feastol) {
        continue;
      }

      if (!rowCoefficientsIntegral(nz.index(), scale)) continue;

      return true;
    }
  }

  if (!runDualDetection) return false;

  if ((model->col_lower_[col] != -kHighsInf &&
       fractionality(model->col_lower_[col]) > options->small_matrix_value) ||
      (model->col_upper_[col] != kHighsInf &&
       fractionality(model->col_upper_[col]) > options->small_matrix_value))
    return false;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    double scale = 1.0 / nz.value();
    if (model->row_upper_[nz.index()] != kHighsInf &&
        fractionality(model->row_upper_[nz.index()] * scale) > primal_feastol)
      return false;

    if (model->row_lower_[nz.index()] != -kHighsInf &&
        fractionality(model->row_lower_[nz.index()] * scale) > primal_feastol)
      return false;

    if (!rowCoefficientsIntegral(nz.index(), scale)) return false;
  }

  return true;
}